

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.h
# Opt level: O2

void __thiscall
dap::ResponseOrError<dap::CMakeInitializeResponse>::~ResponseOrError
          (ResponseOrError<dap::CMakeInitializeResponse> *this)

{
  std::__cxx11::string::~string((string *)&this->error);
  CMakeInitializeResponse::~CMakeInitializeResponse(&this->response);
  return;
}

Assistant:

inline ResponseOrError() = default;